

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O1

char * helicsFilterGetPropertyString(HelicsFilter filt,char *prop)

{
  long *plVar1;
  size_t sVar2;
  char *pcVar3;
  HelicsFilter pvVar4;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pvVar4 = (HelicsFilter)0x0;
  if ((filt != (HelicsFilter)0x0) && (*(int *)((long)filt + 4) == -0x13d9fed9)) {
    pvVar4 = filt;
  }
  pcVar3 = "";
  if ((prop != (char *)0x0) && (pvVar4 != (HelicsFilter)0x0)) {
    plVar1 = *(long **)((long)pvVar4 + 8);
    sVar2 = strlen(prop);
    (**(code **)(*plVar1 + 0x38))(&local_40,plVar1,sVar2,prop);
    if (local_40._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)pvVar4 + 0x38),&local_40);
      pcVar3 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)pvVar4 + 0x38))->_M_dataplus)._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return pcVar3;
}

Assistant:

const char* helicsFilterGetPropertyString(HelicsFilter filt, const char* prop)
{
    static constexpr char nullStr[] = "";
    auto* fObj = getFilterObj(filt, nullptr);
    if (fObj == nullptr || prop == nullptr) {
        return nullStr;
    }
    try {
        auto res = fObj->filtPtr->getString(prop);
        if (res.empty()) {
            return nullStr;
        }
        fObj->buffer = res;
        return fObj->buffer.c_str();
    }
    catch (...) {
        return nullStr;
    }
}